

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

path * __thiscall filesystem::path::filename_abi_cxx11_(path *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  path *in_RSI;
  string *last;
  allocator local_19 [9];
  path *this_local;
  
  this_local = this;
  bVar1 = empty(in_RSI);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&in_RSI->m_path);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&in_RSI->m_path,sVar2 - 1);
    std::__cxx11::string::string((string *)this,(string *)pvVar3);
  }
  return this;
}

Assistant:

std::string filename() const {
        if (empty())
            return "";
        const std::string &last = m_path[m_path.size()-1];
        return last;
    }